

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_VecStr.cpp
# Opt level: O2

string * __thiscall mbc::Val::VecStr::raw_abi_cxx11_(VecStr *this)

{
  string local_40 [32];
  _Alloc_hider local_20;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value
  ;
  
  (*(this->super__ValAtom).super_ValBase._vptr_ValBase[3])(local_40,this);
  std::make_shared<std::__cxx11::string,std::__cxx11::string_const>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20);
  std::__cxx11::string::~string(local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&value);
  return (string *)local_20._M_p;
}

Assistant:

const string& VecStr::raw() const {
    shared_ptr<string> value = std::make_shared<string>(str_());
    return *value;
}